

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

FileDescriptorProto * __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::FindSymbol
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *name)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_28;
  _Self local_20;
  iterator iter;
  string *name_local;
  DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this_local;
  
  iter._M_node = (_Base_ptr)name;
  local_20._M_node = (_Base_ptr)FindLastLessOrEqual(this,name);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>_>
       ::end(&this->by_symbol_);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
             ::operator->(&local_20);
    bVar1 = IsSubSymbol(this,&ppVar2->first,(string *)iter._M_node);
    if (bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::FileDescriptorProto_*>_>
               ::operator->(&local_20);
      return ppVar2->second;
    }
  }
  return (FileDescriptorProto *)0x0;
}

Assistant:

Value SimpleDescriptorDatabase::DescriptorIndex<Value>::FindSymbol(
    const string& name) {
  typename std::map<string, Value>::iterator iter = FindLastLessOrEqual(name);

  return (iter != by_symbol_.end() && IsSubSymbol(iter->first, name)) ?
         iter->second : Value();
}